

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

int match_ldds(MDD *one,MDD *two)

{
  uint local_48;
  uint local_44;
  uint32_t v2;
  uint32_t v1;
  mddnode_t n2;
  mddnode_t n1;
  MDD m2;
  MDD m1;
  MDD *two_local;
  MDD *one_local;
  
  m2 = *one;
  n1 = (mddnode_t)*two;
  if ((m2 == 0) || (n1 == (mddnode_t)0x0)) {
    one_local._4_4_ = 0;
  }
  else {
    n2 = LDD_GETNODE(m2);
    _v2 = LDD_GETNODE((MDD)n1);
    local_44 = mddnode_getvalue(n2);
    local_48 = mddnode_getvalue(_v2);
    while (local_44 != local_48) {
      if (local_44 < local_48) {
        m2 = mddnode_getright(n2);
        if (m2 == 0) {
          return 0;
        }
        n2 = LDD_GETNODE(m2);
        local_44 = mddnode_getvalue(n2);
      }
      else if (local_48 < local_44) {
        n1 = (mddnode_t)mddnode_getright(_v2);
        if (n1 == (mddnode_t)0x0) {
          return 0;
        }
        _v2 = LDD_GETNODE((MDD)n1);
        local_48 = mddnode_getvalue(_v2);
      }
    }
    *one = m2;
    *two = (MDD)n1;
    one_local._4_4_ = 1;
  }
  return one_local._4_4_;
}

Assistant:

static inline int
match_ldds(MDD *one, MDD *two)
{
    MDD m1 = *one, m2 = *two;
    if (m1 == lddmc_false || m2 == lddmc_false) return 0;
    mddnode_t n1 = LDD_GETNODE(m1), n2 = LDD_GETNODE(m2);
    uint32_t v1 = mddnode_getvalue(n1), v2 = mddnode_getvalue(n2);
    while (v1 != v2) {
        if (v1 < v2) {
            m1 = mddnode_getright(n1);
            if (m1 == lddmc_false) return 0;
            n1 = LDD_GETNODE(m1);
            v1 = mddnode_getvalue(n1);
        } else if (v1 > v2) {
            m2 = mddnode_getright(n2);
            if (m2 == lddmc_false) return 0;
            n2 = LDD_GETNODE(m2);
            v2 = mddnode_getvalue(n2);
        }
    }
    *one = m1;
    *two = m2;
    return 1;
}